

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O3

void linker_relrefs(GlobalVars *gv)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  node *pnVar3;
  Reloc *reloc;
  unsigned_long uVar4;
  node *pnVar5;
  node *pnVar6;
  Section *sec;
  char *pcVar7;
  RelocInsert *pRVar8;
  Symbol *pSVar9;
  byte bVar10;
  node *pnVar11;
  int entrytype;
  ulong uVar12;
  ulong uVar13;
  Section *sec_00;
  Symbol *local_50;
  Symbol *local_40;
  
  pnVar11 = (gv->selobjects).first;
  pnVar5 = pnVar11->next;
  if (pnVar5 != (node *)0x0) {
    local_40 = (Symbol *)0x0;
    local_50 = (Symbol *)0x0;
    pSVar9 = (Symbol *)0x0;
    do {
      sec_00 = (Section *)pnVar11[2].next;
      pnVar6 = pnVar5;
      if ((sec_00->n).next != (node *)0x0) {
        do {
          sec_00->relrefs = (RelRef *)0x0;
          for (pnVar5 = (sec_00->xrefs).first; pnVar5->next != (node *)0x0; pnVar5 = pnVar5->next) {
            pnVar6 = pnVar5[3].next;
            if (pnVar6 != (node *)0x0) {
              pnVar3 = pnVar5[2].next;
              uVar12 = sec_00->last_reloc;
              do {
                uVar13 = (long)&pnVar3->next +
                         (ulong)((uint)*(ushort *)&pnVar6->pred +
                                 (uint)*(ushort *)((long)&pnVar6->pred + 2) + 7 >> 3);
                if (uVar12 < uVar13) {
                  sec_00->last_reloc = uVar13;
                  uVar12 = uVar13;
                }
                pnVar6 = pnVar6->next;
              } while (pnVar6 != (node *)0x0);
            }
            pnVar6 = pnVar5[1].pred;
            if (((pnVar6 != (node *)0x0) && (sec = (Section *)pnVar6[3].pred, sec != (Section *)0x0)
                ) && ((*(byte *)&pnVar6[4].next & 0xfe) == 2)) {
              bVar10 = *(byte *)&pnVar5[3].pred;
              if ((((ulong)bVar10 < 0x23) && ((0x600000400U >> ((ulong)bVar10 & 0x3f) & 1) != 0)) &&
                 (*(byte *)&pnVar6[4].next == 3)) {
                sec = scommon_section(gv,sec->obj);
                pnVar6[3].pred = &sec->n;
                bVar10 = *(byte *)&pnVar5[3].pred;
              }
              if ((bVar10 == 0x22) || (bVar10 == 10)) {
                sec->flags = sec->flags | 4;
                if ((gv->textbaserel == 0) && (sec->type == '\x01')) {
                  pcVar7 = getobjname(sec_00->obj);
                  error(0x79,pcVar7,sec_00->name,pnVar5[2].next);
                }
              }
              else if ((bVar10 == 2) && (sec != sec_00)) {
                addrelref(&sec_00->relrefs,sec);
              }
            }
          }
          reloc = (Reloc *)(sec_00->relocs).first;
          pnVar5 = (reloc->n).next;
          while (pnVar5 != (node *)0x0) {
            pRVar8 = reloc->insert;
            if (pRVar8 != (RelocInsert *)0x0) {
              uVar4 = reloc->offset;
              uVar12 = sec_00->last_reloc;
              do {
                uVar13 = ((uint)pRVar8->bpos + (uint)pRVar8->bsiz + 7 >> 3) + uVar4;
                if (uVar12 < uVar13) {
                  sec_00->last_reloc = uVar13;
                  uVar12 = uVar13;
                }
                pRVar8 = pRVar8->next;
              } while (pRVar8 != (RelocInsert *)0x0);
            }
            uVar2 = reloc->rtype;
            switch(uVar2) {
            case '\x02':
              if ((reloc->relocsect).ptr != sec_00) {
                addrelref(&sec_00->relrefs,(reloc->relocsect).ptr);
              }
              break;
            case '\x03':
            case '\x04':
              entrytype = 4;
              goto LAB_0010c3d3;
            case '\x05':
            case '\x06':
            case '\t':
              break;
            case '\a':
            case '\b':
              entrytype = 5;
LAB_0010c3d3:
              dyn_reloc_entry(gv,reloc,entrytype);
              break;
            case '\n':
              puVar1 = &((reloc->relocsect).ptr)->flags;
              *puVar1 = *puVar1 | 4;
              if (pSVar9 == (Symbol *)0x0) {
                pSVar9 = find_any_symbol(gv,sec_00,"_SDA_BASE_");
                if (pSVar9 == (Symbol *)0x0) {
                  pSVar9 = (Symbol *)0x0;
                }
                else {
                  pSVar9->flags = pSVar9->flags | 2;
                }
              }
LAB_0010c466:
              if ((gv->textbaserel == 0) && (((reloc->relocsect).ptr)->type == '\x01')) {
                pcVar7 = getobjname(sec_00->obj);
                error(0x79,pcVar7,sec_00->name,reloc->offset);
              }
              break;
            default:
              if (uVar2 == ' ') {
                if (local_50 == (Symbol *)0x0) {
                  local_50 = find_any_symbol(gv,sec_00,"_SDA2_BASE_");
                  if (local_50 == (Symbol *)0x0) {
                    local_50 = (Symbol *)0x0;
                  }
                  else {
                    local_50->flags = local_50->flags | 2;
                  }
                }
              }
              else if (uVar2 == '\"') {
                puVar1 = &((reloc->relocsect).ptr)->flags;
                *puVar1 = *puVar1 | 4;
                if (local_40 == (Symbol *)0x0) {
                  local_40 = find_any_symbol(gv,sec_00,"__r13_init");
                  if (local_40 == (Symbol *)0x0) {
                    local_40 = (Symbol *)0x0;
                  }
                  else {
                    local_40->flags = local_40->flags | 2;
                  }
                }
                goto LAB_0010c466;
              }
            }
            reloc = (Reloc *)(reloc->n).next;
            pnVar5 = (reloc->n).next;
          }
          sec_00 = (Section *)(sec_00->n).next;
        } while ((sec_00->n).next != (node *)0x0);
        pnVar6 = pnVar11->next;
      }
      pnVar5 = pnVar6->next;
      pnVar11 = pnVar6;
    } while (pnVar5 != (node *)0x0);
  }
  return;
}

Assistant:

void linker_relrefs(struct GlobalVars *gv)
/* All relocations and unresolved xrefs with a relative reference
   to other sections are collected. A second task is to detect
   and handle base-relative and GOT/PLT references. */
{
  struct ObjectUnit *obj;
  struct Section *sec;
  struct Symbol *sdabase = NULL;
  struct Symbol *sda2base = NULL;
  struct Symbol *r13init = NULL;

  for (obj=(struct ObjectUnit *)gv->selobjects.first;
       obj->n.next!=NULL; obj=(struct ObjectUnit *)obj->n.next) {

    for (sec=(struct Section *)obj->sections.first;
         sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
      struct RelRef **rr = &sec->relrefs;
      struct Symbol *xdef;
      struct Reloc *xref,*reloc;

      for (*rr=NULL,xref=(struct Reloc *)sec->xrefs.first;
           xref->n.next!=NULL; xref=(struct Reloc *)xref->n.next) {

        /* remember offset of sections's last xref */
        set_last_sec_reloc(sec,xref);

        if (xdef = xref->relocsect.symbol) {
          if (xdef->relsect!=NULL &&
              (xdef->type==SYM_RELOC || xdef->type==SYM_COMMON)) {

            if ((xref->rtype==R_SD || xref->rtype==R_SD21 ||
                 xref->rtype==R_MOSDREL) && xdef->type==SYM_COMMON) {
                /* small data common symbol - assign .scommon section */
                xdef->relsect = scommon_section(gv,xdef->relsect->obj);
            }

            if (xref->rtype==R_PC && xdef->relsect!=sec) {
              /* relative reference to different section */
              addrelref(rr,xdef->relsect);
            }

            else if (xref->rtype==R_SD || xref->rtype==R_MOSDREL) {
              /* other section is accessed base relative from this one */
              xdef->relsect->flags |= SF_SMALLDATA;
              if (!gv->textbaserel && xdef->relsect->type==ST_CODE)
                error(121,getobjname(sec->obj),sec->name,xref->offset);
            }
          }
        }
      }

      for (reloc=(struct Reloc *)sec->relocs.first;
           reloc->n.next!=NULL; reloc=(struct Reloc *)reloc->n.next) {

        /* remember offset of sections's last reloc */
        set_last_sec_reloc(sec,reloc);

        if (reloc->rtype==R_PC && reloc->relocsect.ptr!=sec) {
          /* relative reference to different section */
          addrelref(rr,reloc->relocsect.ptr);
        }

        else if (reloc->rtype==R_GOT || reloc->rtype==R_GOTPC) {
          /* a local relocation to a GOT entry may create that entry */
          dyn_reloc_entry(gv,reloc,GOT_LOCAL);
        }

        else if (reloc->rtype==R_PLT || reloc->rtype==R_PLTPC) {
          /* a local relocation to a PLT entry may create that entry */
          dyn_reloc_entry(gv,reloc,PLT_LOCAL);
        }

        else if (reloc->rtype == R_SD) {
          /* other section is accessed base relative from this one */
          reloc->relocsect.ptr->flags |= SF_SMALLDATA;
          if (!sdabase) {
            /* R_SD relocation implies a reference to _SDA_BASE_ */
            if (sdabase = find_any_symbol(gv,sec,sdabase_name))
              sdabase->flags |= SYMF_REFERENCED;
          }
          if (!gv->textbaserel && reloc->relocsect.ptr->type==ST_CODE)
            error(121,getobjname(sec->obj),sec->name,reloc->offset);
        }

        else if (reloc->rtype == R_SD2) {
          if (!sda2base) {
            /* R_SD2 relocation implies a reference to _SDA2_BASE_ */
            if (sda2base = find_any_symbol(gv,sec,sda2base_name))
              sda2base->flags |= SYMF_REFERENCED;
          }
        }

        else if (reloc->rtype == R_MOSDREL) {
          /* other section is accessed base relative from this one */
          reloc->relocsect.ptr->flags |= SF_SMALLDATA;
          if (!r13init) {
            /* R_MOSDREL relocation implies a reference to __r13_init */
            if (r13init = find_any_symbol(gv,sec,r13init_name))
              r13init->flags |= SYMF_REFERENCED;
          }
          if (!gv->textbaserel && reloc->relocsect.ptr->type==ST_CODE)
            error(121,getobjname(sec->obj),sec->name,reloc->offset);
        }

      }
    }
  }
}